

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::syntax_tests::iu_GTestSyntaxTest_x_iutest_x_ExceptionValueSTRCASEEQ_Test::
iu_GTestSyntaxTest_x_iutest_x_ExceptionValueSTRCASEEQ_Test
          (iu_GTestSyntaxTest_x_iutest_x_ExceptionValueSTRCASEEQ_Test *this)

{
  iu_GTestSyntaxTest_x_iutest_x_ExceptionValueSTRCASEEQ_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_GTestSyntaxTest_x_iutest_x_ExceptionValueSTRCASEEQ_Test_0062b438;
  return;
}

Assistant:

TEST(GTestSyntaxTest, ExceptionValueSTRCASEEQ)
{
    if( int x = 1 )
        ASSERT_THROW_VALUE_STRCASEEQ(throw "error", const char *, "Error") << x;
    if( int x = 1 )
        EXPECT_THROW_VALUE_STRCASEEQ(throw "error", const char *, "Error") << x;
    if( int x = 1 )
        INFORM_THROW_VALUE_STRCASEEQ(throw "error", const char *, "Error") << x;
    if( int x = 1 )
        ASSUME_THROW_VALUE_STRCASEEQ(throw "error", const char *, "Error") << x;
}